

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RepeatLoopInst::Exec
          (RepeatLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool bVar1;
  BeginLoopInst *pBVar2;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  uint8 *puVar3;
  ResumeCont *this_01;
  RepeatLoopCont *this_02;
  LoopInfo *loopInfo;
  BeginLoopInst *begin;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  RepeatLoopInst *this_local;
  
  pBVar2 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopInst>
                     (matcher,BeginLoop,(this->super_RepeatLoopMixin).beginLabel);
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId
                           );
  if (((pBVar2->super_BeginLoopMixin).hasInnerNondet & 1U) != 0) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo
               ,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  origLoopInfo->number = origLoopInfo->number + 1;
  if (origLoopInfo->number < (pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower
     ) {
    origLoopInfo->startInputOffset = *inputOffset;
    if (((pBVar2->super_BeginLoopMixin).hasInnerNondet & 1U) == 0) {
      Matcher::ResetInnerGroups
                (matcher,(pBVar2->super_BodyGroupsMixin).minBodyGroupId,
                 (pBVar2->super_BodyGroupsMixin).maxBodyGroupId);
    }
    else {
      Matcher::SaveInnerGroups
                (matcher,(pBVar2->super_BodyGroupsMixin).minBodyGroupId,
                 (pBVar2->super_BodyGroupsMixin).maxBodyGroupId,true,input,contStack);
    }
    puVar3 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x1c);
    *instPointer = puVar3;
  }
  else {
    if ((*inputOffset == origLoopInfo->startInputOffset) &&
       ((pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower <
        origLoopInfo->number)) {
      bVar1 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar1;
    }
    if (((pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper == 0xffffffff) ||
       (origLoopInfo->number <
        (pBVar2->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper)) {
      if (((pBVar2->super_GreedyMixin).isGreedy & 1U) == 0) {
        this_02 = (RepeatLoopCont *)
                  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                  Push<UnifiedRegex::RepeatLoopCont>
                            (&contStack->
                              super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        RepeatLoopCont::RepeatLoopCont
                  (this_02,(this->super_RepeatLoopMixin).beginLabel,*inputOffset);
        Matcher::PushStats(matcher,contStack,input);
        puVar3 = Matcher::LabelToInstPointer(matcher,(pBVar2->super_BeginLoopMixin).exitLabel);
        *instPointer = puVar3;
      }
      else {
        this_01 = (ResumeCont *)
                  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                  Push<UnifiedRegex::ResumeCont>
                            (&contStack->
                              super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        ResumeCont::ResumeCont(this_01,*inputOffset,(pBVar2->super_BeginLoopMixin).exitLabel);
        Matcher::PushStats(matcher,contStack,input);
        origLoopInfo->startInputOffset = *inputOffset;
        Matcher::SaveInnerGroups
                  (matcher,(pBVar2->super_BodyGroupsMixin).minBodyGroupId,
                   (pBVar2->super_BodyGroupsMixin).maxBodyGroupId,true,input,contStack);
        puVar3 = Matcher::LabelToInstPointer
                           (matcher,(this->super_RepeatLoopMixin).beginLabel + 0x1c);
        *instPointer = puVar3;
      }
    }
    else {
      puVar3 = Matcher::LabelToInstPointer(matcher,(pBVar2->super_BeginLoopMixin).exitLabel);
      *instPointer = puVar3;
    }
  }
  return false;
}

Assistant:

inline bool RepeatLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopInst* begin = matcher.L2I(BeginLoop, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // See comment (****) above.
        if (begin->hasInnerNondet)
        {
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body.
            loopInfo->startInputOffset = inputOffset;
            if(begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else if (inputOffset == loopInfo->startInputOffset && loopInfo->number > begin->repeats.lower)
        {
            // The minimum number of iterations has been satisfied but the last iteration made no progress.
            //   - With greedy & deterministic body, FAIL so as to undo that iteration and restore group bindings.
            //   - With greedy & non-deterministic body, FAIL so as to try another body alternative
            //   - With non-greedy, we're trying an additional iteration because the follow failed. But
            //     since we didn't consume anything the follow will fail again, so fail
            //
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Success: proceed to remainder.
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else if (begin->isGreedy)
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack continue from here with no more iterations
            PUSH(contStack, ResumeCont, inputOffset, begin->exitLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            loopInfo->startInputOffset = inputOffset;

            // If backtrack, we must continue with previous group bindings
            matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else
        {
            // CHOICEPOINT: Try no more iterations of body, if backtrack do one more iteration of body from here
            PUSH(contStack, RepeatLoopCont, beginLabel, inputOffset);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        return false;
    }